

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

bool rest_mempool(any *context,HTTPRequest *req,string *str_uri_part)

{
  span<const_std::byte,_18446744073709551615UL> reply;
  bool bVar1;
  RESTResponseFormat RVar2;
  int iVar3;
  int iVar4;
  CTxMemPool *pool;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long in_FS_OFFSET;
  string raw_mempool_sequence;
  string raw_verbose;
  string str_json;
  string param;
  string local_230;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<UniValue,_std::allocator<UniValue>_> local_1d0;
  string local_1b8;
  string local_198 [2];
  undefined1 local_158 [32];
  string local_138 [2];
  string local_f8;
  undefined1 local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [32];
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup(req);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_009a8755;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  RVar2 = ParseDataFormat(&local_58,str_uri_part);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"contents");
  if ((iVar3 == 0) ||
     (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_58,"info"), iVar3 == 0)) {
    pool = GetMemPool(context,req);
    if (pool == (CTxMemPool *)0x0) goto LAB_009a8736;
    if (RVar2 != JSON) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"output format not found (available: json)","");
      RESTERR(req,HTTP_NOT_FOUND,&local_230);
      _Var7._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_009a872e;
      goto LAB_009a8736;
    }
    local_98._0_8_ = local_98 + 0x10;
    local_98._8_8_ = (pointer)0x0;
    local_98[0x10] = '\0';
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_58,"contents");
    if (iVar3 == 0) {
      local_b8._M_string_length = 0;
      local_b8.field_2._M_allocated_capacity =
           local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      paVar8 = &local_f8.field_2;
      local_f8._M_dataplus._M_p = (pointer)paVar8;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"verbose","");
      HTTPRequest::GetQueryParameter
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_210,req,&local_f8);
      std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 (optional<std::__cxx11::string> *)local_210,(char (*) [5])0x11442fd);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      if (((bool)local_1f8._M_local_buf[8] == true) &&
         (local_1f8._M_local_buf[8] = false, (undefined1 *)local_210._0_8_ != local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar8) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_b8,"true");
      if ((iVar3 == 0) ||
         (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_b8,"false"), iVar3 == 0)) {
        local_d8._0_8_ = local_d8 + 0x10;
        local_d8._8_8_ = (pointer)0x0;
        local_d8[0x10] = '\0';
        local_158._0_8_ = local_158 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"mempool_sequence","");
        HTTPRequest::GetQueryParameter
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_210,req,(string *)local_158);
        std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                  (&local_f8,(optional<std::__cxx11::string> *)local_210,(char (*) [6])0x11270b1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   &local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar8) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (((bool)local_1f8._M_local_buf[8] == true) &&
           (local_1f8._M_local_buf[8] = false, (undefined1 *)local_210._0_8_ != local_210 + 0x10)) {
          operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
        }
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
        }
        iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_d8,"true");
        if ((iVar3 == 0) ||
           (iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"false"), iVar3 == 0)) {
          iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_b8,"true");
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"true");
          if (iVar4 != 0 || iVar3 != 0) {
            MempoolToJSON((UniValue *)local_210,pool,iVar3 == 0,iVar4 == 0);
            UniValue::write_abi_cxx11_((UniValue *)local_158,(int)local_210,(void *)0x0,0);
            pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_158,"\n");
            local_f8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
            paVar6 = &pbVar5->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == paVar6) {
              local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              local_f8._M_dataplus._M_p = (pointer)paVar8;
            }
            else {
              local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            }
            local_f8._M_string_length = pbVar5->_M_string_length;
            (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
            pbVar5->_M_string_length = 0;
            (pbVar5->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                      &local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar8) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
            }
            UniValue::~UniValue((UniValue *)local_210);
            if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
              operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
            }
            local_1f8._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
            local_210._8_8_ = local_b8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_009a8a50;
            goto LAB_009a8a58;
          }
          paVar8 = &local_1b8.field_2;
          local_1b8._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b8,
                     "Verbose results cannot contain mempool sequence values. (hint: set \"verbose=false\")"
                     ,"");
          RESTERR(req,HTTP_BAD_REQUEST,&local_1b8);
          _Var7._M_p = local_1b8._M_dataplus._M_p;
        }
        else {
          paVar8 = &local_198[0].field_2;
          local_198[0]._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "The \"mempool_sequence\" query parameter must be either \"true\" or \"false\"."
                     ,"");
          RESTERR(req,HTTP_BAD_REQUEST,local_198);
          _Var7._M_p = local_198[0]._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var7._M_p != paVar8) {
          operator_delete(_Var7._M_p,paVar8->_M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) goto LAB_009a8939;
      }
      else {
        local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,
                   "The \"verbose\" query parameter must be either \"true\" or \"false\".","");
        RESTERR(req,HTTP_BAD_REQUEST,local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
          operator_delete(local_138[0]._M_dataplus._M_p,
                          local_138[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_009a8939:
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      bVar1 = false;
    }
    else {
      MempoolInfoToJSON((UniValue *)local_210,pool);
      UniValue::write_abi_cxx11_((UniValue *)local_d8,(int)local_210,(void *)0x0,0);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                      "\n");
      local_b8._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar8 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar8) {
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
      }
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._8_8_ != &local_1f8) {
LAB_009a8a50:
        operator_delete((void *)local_210._8_8_,local_1f8._M_allocated_capacity + 1);
      }
LAB_009a8a58:
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Content-Type","");
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"application/json","");
      HTTPRequest::WriteHeader(req,(string *)local_210,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      bVar1 = true;
      reply._M_extent._M_extent_value = local_98._8_8_;
      reply._M_ptr = (pointer)local_98._0_8_;
      HTTPRequest::WriteReply(req,200,reply);
    }
    if ((pointer)local_98._0_8_ != (pointer)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
    }
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Invalid URI format. Expected /rest/mempool/<info|contents>.json"
               ,"");
    RESTERR(req,HTTP_BAD_REQUEST,&local_78);
    local_230.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
    _Var7._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_009a872e:
      operator_delete(_Var7._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
LAB_009a8736:
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_009a8755:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool rest_mempool(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req))
        return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, str_uri_part);
    if (param != "contents" && param != "info") {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/mempool/<info|contents>.json");
    }

    const CTxMemPool* mempool = GetMemPool(context, req);
    if (!mempool) return false;

    switch (rf) {
    case RESTResponseFormat::JSON: {
        std::string str_json;
        if (param == "contents") {
            std::string raw_verbose;
            try {
                raw_verbose = req->GetQueryParameter("verbose").value_or("true");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_verbose != "true" && raw_verbose != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"verbose\" query parameter must be either \"true\" or \"false\".");
            }
            std::string raw_mempool_sequence;
            try {
                raw_mempool_sequence = req->GetQueryParameter("mempool_sequence").value_or("false");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_mempool_sequence != "true" && raw_mempool_sequence != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"mempool_sequence\" query parameter must be either \"true\" or \"false\".");
            }
            const bool verbose{raw_verbose == "true"};
            const bool mempool_sequence{raw_mempool_sequence == "true"};
            if (verbose && mempool_sequence) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Verbose results cannot contain mempool sequence values. (hint: set \"verbose=false\")");
            }
            str_json = MempoolToJSON(*mempool, verbose, mempool_sequence).write() + "\n";
        } else {
            str_json = MempoolInfoToJSON(*mempool).write() + "\n";
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, str_json);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }
}